

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O2

Statement *
slang::ast::DoWhileLoopStatement::fromSyntax
          (Compilation *compilation,DoWhileStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DoWhileLoopStatement *stmt;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
  guard;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
  local_58;
  SourceRange local_40;
  
  local_58.func.savedFlags.m_bits = (stmtCtx->flags).m_bits;
  local_58.valid = true;
  (stmtCtx->flags).m_bits = local_58.func.savedFlags.m_bits | 1;
  local_58.func.this = stmtCtx;
  iVar2 = Expression::bind((int)(syntax->expr).ptr,(sockaddr *)context,0);
  bVar1 = ASTContext::requireBooleanConvertible(context,(Expression *)CONCAT44(extraout_var,iVar2));
  iVar3 = Statement::bind((int)(syntax->statement).ptr,(sockaddr *)context,(socklen_t)stmtCtx);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::DoWhileLoopStatement,slang::ast::Expression_const&,slang::ast::Statement_const&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,(Expression *)CONCAT44(extraout_var,iVar2),
                    (Statement *)CONCAT44(extraout_var_00,iVar3),&local_40);
  if (!bVar1 || ((Statement *)CONCAT44(extraout_var_00,iVar3))->kind == Invalid) {
    stmt = (DoWhileLoopStatement *)Statement::badStmt(compilation,&stmt->super_Statement);
  }
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/Statement.h:162:37)>
  ::~ScopeGuard(&local_58);
  return &stmt->super_Statement;
}

Assistant:

Statement& DoWhileLoopStatement::fromSyntax(Compilation& compilation,
                                            const DoWhileStatementSyntax& syntax,
                                            const ASTContext& context, StatementContext& stmtCtx) {
    auto guard = stmtCtx.enterLoop();

    bool bad = false;
    auto& condExpr = Expression::bind(*syntax.expr, context);
    if (!context.requireBooleanConvertible(condExpr))
        bad = true;

    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);
    auto result = compilation.emplace<DoWhileLoopStatement>(condExpr, bodyStmt,
                                                            syntax.sourceRange());

    if (bad || bodyStmt.bad())
        return badStmt(compilation, result);
    return *result;
}